

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q3b_kheap_height.cpp
# Opt level: O1

int main(void)

{
  istream *piVar1;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint64_t k;
  uint64_t n;
  long local_20;
  ulong local_18;
  
  piVar1 = std::istream::_M_extract<unsigned_long>(&std::cin);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
  if ((local_20 != 1) && (local_18 != 0)) {
    lVar4 = -1;
    uVar2 = 0;
    do {
      lVar4 = lVar4 + 1;
      auVar6._8_4_ = (int)((ulong)local_20 >> 0x20);
      auVar6._0_8_ = local_20;
      auVar6._12_4_ = 0x45300000;
      auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar8._0_8_ = lVar4;
      auVar8._12_4_ = 0x45300000;
      dVar5 = pow((auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0),
                  (auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
      auVar7._8_4_ = (int)(uVar2 >> 0x20);
      auVar7._0_8_ = uVar2;
      auVar7._12_4_ = 0x45300000;
      dVar5 = (auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) + dVar5;
      uVar2 = (ulong)dVar5;
      uVar2 = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
    } while (uVar2 < local_18);
  }
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  return 0;
}

Assistant:

int main() {
    uint64_t n, k, s, f;
    cin >> n >> k;
    if (k == 1)
        cout << n - k << "\n";
    else {
        s = 0;
        f = 0;
        while (s < n) {
            s += pow(k, f++);
        }
        cout << f - 1 << "\n";
    }
}